

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# l2_error.c
# Opt level: O1

void l2_parsing_error(l2_parsing_error_type error_type,int lines,int cols,...)

{
  undefined8 uVar1;
  char in_AL;
  void **ppvVar2;
  void **ppvVar3;
  void **ppvVar4;
  undefined8 in_RCX;
  ulong uVar5;
  void *pvVar6;
  char *pcVar7;
  uint uVar8;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list va;
  undefined8 uVar9;
  ulong uVar10;
  void *local_c8 [3];
  undefined8 local_b0;
  undefined8 local_a8;
  undefined8 local_a0;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  undefined8 local_38;
  undefined8 local_28;
  
  uVar1 = local_b0;
  if (in_AL != '\0') {
    local_98 = in_XMM0_Qa;
    local_88 = in_XMM1_Qa;
    local_78 = in_XMM2_Qa;
    local_68 = in_XMM3_Qa;
    local_58 = in_XMM4_Qa;
    local_48 = in_XMM5_Qa;
    local_38 = in_XMM6_Qa;
    local_28 = in_XMM7_Qa;
  }
  ppvVar2 = &va[0].overflow_arg_area;
  uVar9 = 0x3000000018;
  local_b0 = in_RCX;
  local_a8 = in_R8;
  local_a0 = in_R9;
  switch(error_type) {
  case L2_PARSING_ERROR_ILLEGAL_CHARACTER:
    uVar8 = (uint)(char)local_b0;
    fprintf(_stderr,anon_var_dwarf_2b0a,lines,(ulong)(uint)cols,(ulong)uVar8,(ulong)uVar8,
            0x3000000020,ppvVar2);
    goto LAB_00103e7d;
  case L2_PARSING_ERROR_ILLEGAL_NUMBER_IN_AN_OCTAL_LITERAL:
    uVar8 = (uint)(char)local_b0;
    fprintf(_stderr,anon_var_dwarf_2b2a,lines,(ulong)(uint)cols,(ulong)uVar8,in_R9,0x3000000020,
            ppvVar2);
    goto LAB_00103e7d;
  case L2_PARSING_ERROR_INCOMPLETE_HEX_LITERAL:
    pcVar7 = anon_var_dwarf_2b40;
    break;
  case L2_PARSING_ERROR_EMPTY_CHARACTER_LITERAL:
    pcVar7 = anon_var_dwarf_2b6c;
    break;
  case L2_PARSING_ERROR_INCOMPLETE_CHARACTER_LITERAL:
    pcVar7 = anon_var_dwarf_2b76;
    break;
  case L2_PARSING_ERROR_INCOMPLETE_REAL_LITERAL:
    pcVar7 = anon_var_dwarf_2b56;
    break;
  case L2_PARSING_ERROR_MULTI_CHARACTER_IN_SINGLE_CHARACTER_LITERAL:
    pcVar7 = anon_var_dwarf_2b8c;
    break;
  case L2_PARSING_ERROR_INCOMPLETE_STRING_LITERAL:
    pcVar7 = anon_var_dwarf_2ba2;
    break;
  case L2_PARSING_ERROR_UNEXPECTED_TOKEN:
    uVar9 = 0x3000000020;
    pcVar7 = anon_var_dwarf_2b14;
    break;
  case L2_PARSING_ERROR_MISSING_COLON:
    pcVar7 = anon_var_dwarf_2bb8;
    break;
  case L2_PARSING_ERROR_MISSING_SEMICOLON:
    pcVar7 = anon_var_dwarf_2bce;
    break;
  case L2_PARSING_ERROR_MISSING_RBRACE:
    pcVar7 = anon_var_dwarf_2be4;
    break;
  case L2_PARSING_ERROR_MISSING_RP:
    pcVar7 = anon_var_dwarf_2bfa;
    break;
  case L2_PARSING_ERROR_IDENTIFIER_UNDEFINED:
    pcVar7 = anon_var_dwarf_2c10;
    goto LAB_00103e73;
  case L2_PARSING_ERROR_IDENTIFIER_REDEFINED:
    pcVar7 = anon_var_dwarf_2c26;
    goto LAB_00103e73;
  case L2_PARSING_ERROR_REFERENCE_SYMBOL_BEFORE_INITIALIZATION:
    pcVar7 = anon_var_dwarf_2c30;
    goto LAB_00103e73;
  case L2_PARSING_ERROR_INCOMPATIBLE_OPERATION:
    uVar5 = 0x3000000020;
    fprintf(_stderr,anon_var_dwarf_2c46,lines,(ulong)(uint)cols,uVar1);
    if ((uVar5 & 0xffffffff) < 0x29) {
      ppvVar2 = (void **)((long)local_c8 + (uVar5 & 0xffffffff));
    }
    pvVar6 = *ppvVar2;
    pcVar7 = anon_var_dwarf_2c50;
    goto LAB_00103e48;
  case L2_PARSING_ERROR_DIVIDE_BY_ZERO:
    pcVar7 = anon_var_dwarf_2c66;
    break;
  case L2_PARSING_ERROR_EXPR_NOT_BOOL:
    pcVar7 = anon_var_dwarf_2c7c;
    break;
  case L2_PARSING_ERROR_LEFT_SIDE_OF_OPERATOR_MUST_BE_A_BOOL_VALUE:
    pcVar7 = anon_var_dwarf_2c9c;
    goto LAB_00103e73;
  case L2_PARSING_ERROR_RIGHT_SIDE_OF_OPERATOR_MUST_BE_A_BOOL_VALUE:
    pcVar7 = anon_var_dwarf_2c86;
    goto LAB_00103e73;
  case L2_PARSING_ERROR_LEFT_SIDE_OF_OPERATOR_MUST_BE_A_INTEGER_VALUE:
    pcVar7 = anon_var_dwarf_2ca6;
    goto LAB_00103e73;
  case L2_PARSING_ERROR_RIGHT_SIDE_OF_OPERATOR_MUST_BE_A_INTEGER_VALUE:
    pcVar7 = anon_var_dwarf_2cb0;
    goto LAB_00103e73;
  case L2_PARSING_ERROR_DUALISTIC_OPERATOR_CONTAINS_INCOMPATIBLE_TYPE:
    uVar10 = 0x3000000020;
    fprintf(_stderr,anon_var_dwarf_2cba,lines,(ulong)(uint)cols,uVar1);
    uVar5 = uVar10 & 0xffffffff;
    if (uVar5 < 0x29) {
      uVar10 = (ulong)((int)uVar10 + 8);
      ppvVar3 = (void **)((long)local_c8 + uVar5);
      ppvVar4 = ppvVar2;
    }
    else {
      ppvVar4 = ppvVar2 + 1;
      ppvVar3 = ppvVar2;
    }
    fprintf(_stderr,"<%s> \'%s\' ",*ppvVar3,uVar1);
    if ((uVar10 & 0xffffffff) < 0x29) {
      ppvVar4 = (void **)((long)local_c8 + (uVar10 & 0xffffffff));
    }
    pvVar6 = *ppvVar4;
    pcVar7 = "<%s>\n";
LAB_00103e48:
    fprintf(_stderr,pcVar7,pvVar6);
    goto LAB_00103e7d;
  case L2_PARSING_ERROR_UNITARY_OPERATOR_CONTAINS_INCOMPATIBLE_TYPE:
    uVar5 = 0x3000000020;
    fprintf(_stderr,anon_var_dwarf_2cf0,lines,(ulong)(uint)cols,uVar1);
    if ((uVar5 & 0xffffffff) < 0x29) {
      ppvVar2 = (void **)((long)local_c8 + (uVar5 & 0xffffffff));
    }
    fprintf(_stderr,"\'%s\' <%s>\n",uVar1,*ppvVar2);
    goto LAB_00103e7d;
  case L2_PARSING_ERROR_INVALID_CONTINUE_IN_CURRENT_CONTEXT:
    pcVar7 = anon_var_dwarf_2d04;
    break;
  case L2_PARSING_ERROR_INVALID_BREAK_IN_CURRENT_CONTEXT:
    pcVar7 = anon_var_dwarf_2d0e;
    break;
  case L2_PARSING_ERROR_INVALID_RETURN_IN_CURRENT_CONTEXT:
    pcVar7 = anon_var_dwarf_2d24;
    break;
  case L2_PARSING_ERROR_SYMBOL_IS_NOT_PROCEDURE:
    pcVar7 = anon_var_dwarf_2d3a;
LAB_00103e73:
    fprintf(_stderr,pcVar7,lines,(ulong)(uint)cols,uVar1,in_R9,0x3000000020,ppvVar2);
    goto LAB_00103e7d;
  case L2_PARSING_ERROR_TOO_MANY_PARAMETERS:
    pcVar7 = anon_var_dwarf_2d50;
    break;
  case L2_PARSING_ERROR_TOO_FEW_PARAMETERS:
    pcVar7 = anon_var_dwarf_2d5a;
    break;
  case L2_PARSING_ERROR_EXPR_RESULT_WITHOUT_VALUE:
    pcVar7 = anon_var_dwarf_2d64;
    break;
  case L2_PARSING_ERROR_INCOMPATIBLE_EXPR_TYPE:
    pcVar7 = anon_var_dwarf_2d7a;
    break;
  case L2_PARSING_ERROR_INCOMPATIBLE_SYMBOL_TYPE:
    pcVar7 = anon_var_dwarf_2d84;
    break;
  default:
    fwrite(anon_var_dwarf_2d8e,0x30,1,_stderr);
    goto LAB_00103e7d;
  }
  fprintf(_stderr,pcVar7,lines,(ulong)(uint)cols,in_R8,in_R9,uVar9,ppvVar2);
LAB_00103e7d:
  fwrite(anon_var_dwarf_2af4,0x1c,1,_stderr);
  l2_clean_before_abort();
  exit(error_type);
}

Assistant:

void _Noreturn l2_parsing_error(const l2_parsing_error_type error_type, int lines, int cols, ...) {

    va_list va;
    va_start(va, cols);

    char illegal_char;
    char *token_str, *token_str2;
    l2_token *token_p;

    switch (error_type) {
        case L2_PARSING_ERROR_ILLEGAL_CHARACTER:
            illegal_char = (char)va_arg(va, int);
            fprintf(stderr, "L2 脚本解释错误 (在 %d 行 %d 列附近): \n\t解析到非法字符 \'%c\'(0x%X)\n", lines, cols, illegal_char, illegal_char);
            break;

        case L2_PARSING_ERROR_UNEXPECTED_TOKEN:
            token_p = va_arg(va, l2_token *);
            /*
            switch (token_p->type) {

            }*/
            fprintf(stderr, "L2 脚本解释错误 (在 %d 行 %d 列附近): \n\t解析到非法词法元素\n", lines, cols);
            break;

        case L2_PARSING_ERROR_ILLEGAL_NUMBER_IN_AN_OCTAL_LITERAL:
            illegal_char = (char)va_arg(va, int);
            fprintf(stderr, "L2 脚本解释错误 (在 %d 行 %d 列附近): \n\t在八进制字面量中包含了非法数字 \'%c\'\n", lines, cols, illegal_char);
            break;

        case L2_PARSING_ERROR_INCOMPLETE_HEX_LITERAL:
            fprintf(stderr, "L2 脚本解释错误 (在 %d 行 %d 列附近): \n\t不完整的十六进制字面量\n", lines, cols);
            break;

        case L2_PARSING_ERROR_INCOMPLETE_REAL_LITERAL:
            fprintf(stderr, "L2 脚本解释错误 (在 %d 行 %d 列附近): \n\t不完整的实数 (real) 字面量\n", lines, cols);
            break;

        case L2_PARSING_ERROR_EMPTY_CHARACTER_LITERAL:
            fprintf(stderr, "L2 脚本解释错误 (在 %d 行 %d 列附近): \n\t字符字面量不能为空\n", lines, cols);
            break;

        case L2_PARSING_ERROR_INCOMPLETE_CHARACTER_LITERAL:
            fprintf(stderr, "L2 脚本解释错误 (在 %d 行 %d 列附近): \n\t不完整的字符字面量, 字符字面量应该以单引号 ' 结束\n", lines, cols);
            break;

        case L2_PARSING_ERROR_MULTI_CHARACTER_IN_SINGLE_CHARACTER_LITERAL:
            fprintf(stderr, "L2 脚本解释错误 (在 %d 行 %d 列附近): \n\t在单个字符字面量中出现多个字符\n", lines, cols);
            break;

        case L2_PARSING_ERROR_INCOMPLETE_STRING_LITERAL:
            fprintf(stderr, "L2 脚本解释错误 (在 %d 行 %d 列附近): \n\t不完整的字符串字面量, 字符串字面量应该以双引号 \" 结束\n", lines, cols);
            break;

        case L2_PARSING_ERROR_MISSING_COLON:
            fprintf(stderr, "L2 脚本解释错误 (在 %d 行 %d 列附近): \n\t不完整的条件表达式, 可能缺少冒号 \':\'\n", lines, cols);
            break;

        case L2_PARSING_ERROR_MISSING_SEMICOLON:
            fprintf(stderr, "L2 脚本解释错误 (在 %d 行 %d 列附近): \n\t在语句末尾可能缺少了分号\n", lines, cols);
            break;

        case L2_PARSING_ERROR_MISSING_RBRACE:
            fprintf(stderr, "L2 脚本解释错误 (在 %d 行 %d 列附近): \n\t缺少块结束符, 右花括号 }\n", lines, cols);
            break;

        case L2_PARSING_ERROR_MISSING_RP:
            fprintf(stderr, "L2 脚本解释错误 (在 %d 行 %d 列附近): \n\t缺少右圆括号 \')\'\n", lines, cols);
            break;

        case L2_PARSING_ERROR_IDENTIFIER_UNDEFINED:
            token_str = va_arg(va, char *);
            fprintf(stderr, "L2 脚本解释错误 (在 %d 行 %d 列附近): \n\t标识符 \'%s\' 未定义\n", lines, cols, token_str);
            break;

        case L2_PARSING_ERROR_IDENTIFIER_REDEFINED:
            token_str = va_arg(va, char *);
            fprintf(stderr, "L2 脚本解释错误 (在 %d 行 %d 列附近): \n\t标识符 \'%s\' 重定义\n", lines, cols, token_str);
            break;

        case L2_PARSING_ERROR_REFERENCE_SYMBOL_BEFORE_INITIALIZATION:
            token_str = va_arg(va, char *);
            fprintf(stderr, "L2 脚本解释错误 (在 %d 行 %d 列附近): \n\t符号 \'%s\' 在初始化之前被引用了\n", lines, cols, token_str);
            break;

        case L2_PARSING_ERROR_INCOMPATIBLE_OPERATION:
            token_str = va_arg(va, char *);
            fprintf(stderr, "L2 脚本解释错误 (在 %d 行 %d 列附近): \n\t不兼容的操作 \'%s\' 在 ", lines, cols, token_str);
            token_str = va_arg(va, char *);
            fprintf(stderr, "%s 之上\n", token_str);
            break;

        case L2_PARSING_ERROR_DIVIDE_BY_ZERO:
            fprintf(stderr, "L2 脚本解释错误 (在 %d 行 %d 列附近): \n\t试图除以整数 0\n", lines, cols);
            break;

        case L2_PARSING_ERROR_EXPR_NOT_BOOL:
            fprintf(stderr, "L2 脚本解释错误 (在 %d 行 %d 列附近): \n\t表达式不是布尔类型 (bool)\n", lines, cols);
            break;

        case L2_PARSING_ERROR_RIGHT_SIDE_OF_OPERATOR_MUST_BE_A_BOOL_VALUE:
            token_str = va_arg(va, char *);
            fprintf(stderr, "L2 脚本解释错误 (在 %d 行 %d 列附近): \n\t操作符 \'%s\' 的右侧必须是布尔类型 (bool) 的值\n", lines, cols, token_str);
            break;

        case L2_PARSING_ERROR_LEFT_SIDE_OF_OPERATOR_MUST_BE_A_BOOL_VALUE:
            token_str = va_arg(va, char *);
            fprintf(stderr, "L2 脚本解释错误 (在 %d 行 %d 列附近): \n\t操作符 \'%s\' 的左侧必须是布尔类型 (bool) 的值\n", lines, cols, token_str);
            break;

        case L2_PARSING_ERROR_LEFT_SIDE_OF_OPERATOR_MUST_BE_A_INTEGER_VALUE:
            token_str = va_arg(va, char *);
            fprintf(stderr, "L2 脚本解释错误 (在 %d 行 %d 列附近): \n\t操作符 \'%s\' 的左侧必须是整数型 (integer) 的值\n", lines, cols, token_str);
            break;

        case L2_PARSING_ERROR_RIGHT_SIDE_OF_OPERATOR_MUST_BE_A_INTEGER_VALUE:
            token_str = va_arg(va, char *);
            fprintf(stderr, "L2 脚本解释错误 (在 %d 行 %d 列附近): \n\t操作符 \'%s\' 的右侧必须是整数型 (integer) 的值\n", lines, cols, token_str);
            break;

        case L2_PARSING_ERROR_DUALISTIC_OPERATOR_CONTAINS_INCOMPATIBLE_TYPE:
            token_str = va_arg(va, char *);
            fprintf(stderr, "L2 脚本解释错误 (在 %d 行 %d 列附近): \n\t操作符 \'%s\' 作用于不兼容的类型之上, ", lines, cols, token_str);
            token_str2 = va_arg(va, char *);
            fprintf(stderr, "<%s> \'%s\' ", token_str2, token_str);
            token_str2 = va_arg(va, char *);
            fprintf(stderr, "<%s>\n", token_str2);
            break;

        case L2_PARSING_ERROR_UNITARY_OPERATOR_CONTAINS_INCOMPATIBLE_TYPE:
            token_str = va_arg(va, char *);
            fprintf(stderr, "L2 脚本解释错误 (在 %d 行 %d 列附近): \n\t操作符 \'%s\' 的右侧具有不兼容的类型, ", lines, cols, token_str);
            token_str2 = va_arg(va, char *);
            fprintf(stderr, "\'%s\' <%s>\n", token_str, token_str2);
            break;

        case L2_PARSING_ERROR_INVALID_CONTINUE_IN_CURRENT_CONTEXT:
            fprintf(stderr, "L2 脚本解释错误 (在 %d 行 %d 列附近): \n\t在当前的上下文中出现无效的关键字 \'continue\'\n", lines, cols);
            break;

        case L2_PARSING_ERROR_INVALID_BREAK_IN_CURRENT_CONTEXT:
            fprintf(stderr, "L2 脚本解释错误 (在 %d 行 %d 列附近): \n\t在当前的上下文中出现无效的关键字 \'break\'\n", lines, cols);
            break;

        case L2_PARSING_ERROR_INVALID_RETURN_IN_CURRENT_CONTEXT:
            fprintf(stderr, "L2 脚本解释错误 (在 %d 行 %d 列附近): \n\t在当前的上下文中出现无效的关键字 \'return\'\n", lines, cols);
            break;

        case L2_PARSING_ERROR_SYMBOL_IS_NOT_PROCEDURE:
            token_str = va_arg(va, char *);
            fprintf(stderr, "L2 脚本解释错误 (在 %d 行 %d 列附近): \n\t符号 \'%s\' 并非过程, 无法进行调用\n", lines, cols, token_str);
            break;

        case L2_PARSING_ERROR_TOO_MANY_PARAMETERS:
            fprintf(stderr, "L2 脚本解释错误 (在 %d 行 %d 列附近): \n\t调用过程的参数太多\n", lines, cols);
            break;

        case L2_PARSING_ERROR_TOO_FEW_PARAMETERS:
            fprintf(stderr, "L2 脚本解释错误 (在 %d 行 %d 列附近): \n\t调用过程的参数太少\n", lines, cols);
            break;

        case L2_PARSING_ERROR_EXPR_RESULT_WITHOUT_VALUE:
            fprintf(stderr, "L2 脚本解释错误 (在 %d 行 %d 列附近): \n\t表达式并不具有任何值\n", lines, cols);
            break;

        case L2_PARSING_ERROR_INCOMPATIBLE_EXPR_TYPE:
            fprintf(stderr, "L2 脚本解释错误 (在 %d 行 %d 列附近): \n\t不兼容的表达式值类型\n", lines, cols);
            break;

        case L2_PARSING_ERROR_INCOMPATIBLE_SYMBOL_TYPE:
            fprintf(stderr, "L2 脚本解释错误 (在 %d 行 %d 列附近): \n\t不兼容的符号类型\n", lines, cols);
            break;

        default:
            fprintf(stderr, "L2 脚本解释错误, 出现一个未知错误\n");
    }

    fprintf(stderr, "L2 解释器已异常终止\n");

    va_end(va);
    l2_clean_before_abort();
    exit(error_type);
}